

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_align.cpp
# Opt level: O2

Read<int> __thiscall
Omega_h::align_ev2v_deg<2,long>(Omega_h *this,Read<int> *ev2v,Read<signed_char> *codes)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  uint uVar3;
  ulong uVar4;
  void *extraout_RDX;
  size_t sVar5;
  int n;
  Read<int> RVar6;
  allocator local_79;
  Write<int> ev2v_w;
  Write<int> local_68;
  type f;
  
  pAVar1 = (ev2v->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar4 = pAVar1->size;
  }
  else {
    uVar4 = (ulong)pAVar1 >> 3;
  }
  pAVar2 = (codes->write_).shared_alloc_.alloc;
  uVar3 = (uint)(uVar4 >> 3);
  if (((ulong)pAVar2 & 1) == 0) {
    n = (int)pAVar2->size;
    if (n * 2 == uVar3) {
LAB_0021270b:
      if (((ulong)pAVar1 & 1) == 0) {
        sVar5 = pAVar1->size;
      }
      else {
        sVar5 = (ulong)pAVar1 >> 3;
      }
      std::__cxx11::string::string((string *)&f,"",&local_79);
      Write<long>::Write((Write<long> *)&ev2v_w,(LO)(sVar5 >> 3),(string *)&f);
      std::__cxx11::string::~string((string *)&f);
      Write<signed_char>::Write((Write<signed_char> *)&f,&codes->write_);
      Write<long>::Write(&f.ev2v.write_,&ev2v->write_);
      Write<long>::Write(&f.ev2v_w,&ev2v_w);
      parallel_for<Omega_h::align_ev2v_deg<2,long>(Omega_h::Read<long>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
                (n,&f,"align_ev2v");
      Write<long>::Write(&local_68,&ev2v_w);
      Read<long>::Read((Read<signed_char> *)this,(Write<long> *)&local_68);
      Write<long>::~Write((Write<long> *)&local_68);
      align_ev2v_deg<2,long>(Omega_h::Read<long>,Omega_h::Read<signed_char>)::{lambda(int)#1}::~Read
                ((_lambda_int__1_ *)&f);
      Write<long>::~Write((Write<long> *)&ev2v_w);
      RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
      RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<int>)RVar6.write_.shared_alloc_;
    }
  }
  else if (((uint)((ulong)pAVar2 >> 2) & 0xfffffffe) == uVar3) {
    n = (int)((ulong)pAVar2 >> 3);
    goto LAB_0021270b;
  }
  fail("assertion %s failed at %s +%d\n","ev2v.size() == codes.size() * deg",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_align.cpp"
       ,9);
}

Assistant:

Read<T> align_ev2v_deg(Read<T> ev2v, Read<I8> codes) {
  OMEGA_H_CHECK(ev2v.size() == codes.size() * deg);
  auto ne = codes.size();
  Write<T> ev2v_w(ev2v.size());
  auto f = OMEGA_H_LAMBDA(LO e) {
    align_adj<deg>(codes[e], ev2v, e * deg, ev2v_w, e * deg);
  };
  parallel_for(ne, f, "align_ev2v");
  return ev2v_w;
}